

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

double cfgfile::format_t<double,_cfgfile::wstring_trait_t>::from_string
                 (parser_info_t<cfgfile::wstring_trait_t> *info,string_t *value)

{
  exception_t<cfgfile::wstring_trait_t> *this;
  double dVar1;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  size_t pos;
  string local_230;
  string_t local_210;
  wstring local_1f0;
  string local_1d0;
  string_t local_1b0;
  string local_190;
  string_t local_170;
  string local_150;
  string_t local_130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_d0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_b0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_90 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  pos = 0;
  dVar1 = std::__cxx11::stod(value,&pos);
  if (pos == value->_M_string_length) {
    return dVar1;
  }
  this = (exception_t<cfgfile::wstring_trait_t> *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"Invalid value: \"",&local_23a);
  wstring_trait_t::from_ascii(&local_130,&local_150);
  std::operator+(&local_110,&local_130,value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"\". In file \"",&local_23b);
  wstring_trait_t::from_ascii(&local_170,&local_190);
  std::operator+(&local_f0,&local_110,&local_170);
  std::operator+(&local_d0,&local_f0,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"\" on line ",&local_23c);
  wstring_trait_t::from_ascii(&local_1b0,&local_1d0);
  std::operator+(&local_b0,&local_d0,&local_1b0);
  std::__cxx11::to_wstring(&local_1f0,info->m_line_number);
  std::operator+(local_90,&local_b0,&local_1f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,".",&local_239);
  wstring_trait_t::from_ascii(&local_210,&local_230);
  std::operator+(&local_50,local_90,&local_210);
  exception_t<cfgfile::wstring_trait_t>::exception_t(this,&local_50);
  __cxa_throw(this,&exception_t<cfgfile::wstring_trait_t>::typeinfo,
              exception_t<cfgfile::wstring_trait_t>::~exception_t);
}

Assistant:

static double from_string( const parser_info_t< wstring_trait_t > & info,
		const wstring_trait_t::string_t & value )
	{
		try {
			std::size_t pos = 0;

			double result = std::stod( value, &pos );

			if( pos != value.length() )
				throw exception_t< wstring_trait_t >(
					wstring_trait_t::from_ascii( "Invalid value: \"" ) +
					value + wstring_trait_t::from_ascii( "\". In file \"" ) +
					info.file_name() +
					wstring_trait_t::from_ascii( "\" on line " ) +
					wstring_trait_t::to_string( info.line_number() ) +
					wstring_trait_t::from_ascii( "." ) );

			return result;
		}
		catch( const std::exception & )
		{
			throw exception_t< wstring_trait_t >(
				wstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + wstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				wstring_trait_t::from_ascii( "\" on line " ) +
				wstring_trait_t::to_string( info.line_number() ) +
				wstring_trait_t::from_ascii( "." ) );
		}
	}